

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

bool __thiscall
HighsHashTree<int,_int>::InnerLeaf<3>::find_key(InnerLeaf<3> *this,int *key,uint16_t *hash,int *pos)

{
  const_reference pvVar1;
  const_reference this_00;
  int *piVar2;
  int *in_RCX;
  ushort *in_RDX;
  int *in_RSI;
  array<unsigned_long,_39UL> *in_RDI;
  int in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint uVar3;
  
  while( true ) {
    uVar3 = in_stack_ffffffffffffffcc & 0xffffff;
    if (*in_RCX != (int)in_RDI->_M_elems[1]) {
      pvVar1 = std::array<unsigned_long,_39UL>::operator[]
                         (in_RDI,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8) &
                                 0xffffffffffffff);
      uVar3 = CONCAT13(*pvVar1 == (ulong)*in_RDX,(int3)uVar3);
    }
    in_stack_ffffffffffffffcc = uVar3;
    if ((char)(in_stack_ffffffffffffffcc >> 0x18) == '\0') break;
    in_stack_ffffffffffffffc8 = *in_RSI;
    this_00 = std::array<HighsHashTableEntry<int,_int>,_38UL>::operator[]
                        ((array<HighsHashTableEntry<int,_int>,_38UL> *)in_RDI,
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    piVar2 = HighsHashTableEntry<int,_int>::key(this_00);
    if (in_stack_ffffffffffffffc8 == *piVar2) {
      return true;
    }
    *in_RCX = *in_RCX + 1;
  }
  return false;
}

Assistant:

bool find_key(const K& key, const uint16_t& hash, int& pos) const {
      // find key
      while (pos != size && hashes[pos] == hash) {
        if (key == entries[pos].key()) return true;
        ++pos;
      }
      return false;
    }